

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O2

StyleSheetContainer * Rml::StyleSheetFactory::GetStyleSheetContainer(String *sheet_name)

{
  StyleSheetContainer *pSVar1;
  StyleSheetContainer *in_RAX;
  type puVar2;
  pointer *__ptr;
  String *sheet;
  iterator iVar3;
  StyleSheetContainer *local_18;
  
  sheet = sheet_name;
  local_18 = in_RAX;
  iVar3 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(instance,sheet_name);
  if (iVar3.mKeyVals == (NodePtr)instance->mInfo) {
    LoadStyleSheetContainer((StyleSheetFactory *)&stack0xffffffffffffffe8,sheet);
    if (local_18 != (StyleSheetContainer *)0x0) {
      puVar2 = robin_hood::detail::
               Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
               ::
               doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>>
                         ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                           *)instance,sheet_name);
      pSVar1 = (puVar2->_M_t).
               super___uniq_ptr_impl<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Rml::StyleSheetContainer_*,_std::default_delete<const_Rml::StyleSheetContainer>_>
               .super__Head_base<0UL,_const_Rml::StyleSheetContainer_*,_false>._M_head_impl;
      (puVar2->_M_t).
      super___uniq_ptr_impl<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Rml::StyleSheetContainer_*,_std::default_delete<const_Rml::StyleSheetContainer>_>
      .super__Head_base<0UL,_const_Rml::StyleSheetContainer_*,_false>._M_head_impl = local_18;
      if (pSVar1 != (StyleSheetContainer *)0x0) {
        (*pSVar1->_vptr_StyleSheetContainer[1])();
      }
    }
  }
  else {
    local_18 = ((iVar3.mKeyVals)->mData).second._M_t.
               super___uniq_ptr_impl<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Rml::StyleSheetContainer_*,_std::default_delete<const_Rml::StyleSheetContainer>_>
               .super__Head_base<0UL,_const_Rml::StyleSheetContainer_*,_false>._M_head_impl;
  }
  return local_18;
}

Assistant:

const StyleSheetContainer* StyleSheetFactory::GetStyleSheetContainer(const String& sheet_name)
{
	// Look up the sheet definition in the cache
	auto it = instance->stylesheets.find(sheet_name);
	if (it != instance->stylesheets.end())
		return it->second.get();

	// Don't currently have the sheet, attempt to load it
	UniquePtr<const StyleSheetContainer> sheet = instance->LoadStyleSheetContainer(sheet_name);
	if (!sheet)
		return nullptr;

	const StyleSheetContainer* result = sheet.get();

	// Add it to the cache.
	instance->stylesheets[sheet_name] = std::move(sheet);

	return result;
}